

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__getn(stbi__context *s,stbi_uc *buffer,int n)

{
  int iVar1;
  int iVar2;
  int in_EDX;
  void *in_RSI;
  long in_RDI;
  int count;
  int res;
  int blen;
  uint local_4;
  
  if ((*(long *)(in_RDI + 0x10) == 0) ||
     (iVar1 = (int)*(undefined8 *)(in_RDI + 200) - (int)*(undefined8 *)(in_RDI + 0xc0),
     in_EDX <= iVar1)) {
    if (*(ulong *)(in_RDI + 200) < (ulong)(*(long *)(in_RDI + 0xc0) + (long)in_EDX)) {
      local_4 = 0;
    }
    else {
      memcpy(in_RSI,*(void **)(in_RDI + 0xc0),(long)in_EDX);
      *(long *)(in_RDI + 0xc0) = *(long *)(in_RDI + 0xc0) + (long)in_EDX;
      local_4 = 1;
    }
  }
  else {
    memcpy(in_RSI,*(void **)(in_RDI + 0xc0),(long)iVar1);
    iVar2 = (**(code **)(in_RDI + 0x10))
                      (*(undefined8 *)(in_RDI + 0x28),(long)in_RSI + (long)iVar1,in_EDX - iVar1);
    local_4 = (uint)(iVar2 == in_EDX - iVar1);
    *(undefined8 *)(in_RDI + 0xc0) = *(undefined8 *)(in_RDI + 200);
  }
  return local_4;
}

Assistant:

static int stbi__getn(stbi__context *s, stbi_uc *buffer, int n)
{
   if (s->io.read) {
      int blen = (int) (s->img_buffer_end - s->img_buffer);
      if (blen < n) {
         int res, count;

         memcpy(buffer, s->img_buffer, blen);

         count = (s->io.read)(s->io_user_data, (char*) buffer + blen, n - blen);
         res = (count == (n-blen));
         s->img_buffer = s->img_buffer_end;
         return res;
      }
   }

   if (s->img_buffer+n <= s->img_buffer_end) {
      memcpy(buffer, s->img_buffer, n);
      s->img_buffer += n;
      return 1;
   } else
      return 0;
}